

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O2

int __thiscall HighsMipSolverData::init(HighsMipSolverData *this,EVP_PKEY_CTX *ctx)

{
  double dVar1;
  HighsLp *pHVar2;
  HighsOptions *pHVar3;
  int iVar4;
  HighsMipSolver *pHVar5;
  HighsInt HVar6;
  int64_t iVar7;
  int64_t iVar8;
  
  pHVar2 = this->mipsolver->model_;
  presolve::HighsPostsolveStack::initializeIndexMaps
            (&this->postSolveStack,pHVar2->num_row_,pHVar2->num_col_);
  pHVar5 = this->mipsolver;
  pHVar3 = pHVar5->options_mip_;
  pHVar2 = pHVar5->model_;
  pHVar5->orig_model_ = pHVar2;
  this->feastol = (pHVar3->super_HighsOptionsStruct).mip_feasibility_tolerance;
  this->epsilon = (pHVar3->super_HighsOptionsStruct).small_matrix_value;
  if (pHVar5->clqtableinit != (HighsCliqueTable *)0x0) {
    HighsCliqueTable::buildFrom(&this->cliquetable,pHVar2,pHVar5->clqtableinit);
  }
  iVar4 = ::highs::parallel::num_threads();
  pHVar5 = this->mipsolver;
  HVar6 = 0x7fffffff;
  if (1 < iVar4) {
    HVar6 = (pHVar5->options_mip_->super_HighsOptionsStruct).
            mip_min_cliquetable_entries_for_parallelism;
  }
  (this->cliquetable).minEntriesForParallelism = HVar6;
  if (pHVar5->implicinit != (HighsImplications *)0x0) {
    HighsImplications::buildFrom(&this->implications,pHVar5->implicinit);
    pHVar5 = this->mipsolver;
  }
  pHVar3 = pHVar5->options_mip_;
  this->heuristic_effort = (pHVar3->super_HighsOptionsStruct).mip_heuristic_effort;
  this->detectSymmetries = (pHVar3->super_HighsOptionsStruct).mip_detect_symmetry;
  this->firstlpsolobj = -INFINITY;
  this->rootlpsolobj = -INFINITY;
  this->analyticCenterComputed = false;
  this->analyticCenterStatus = kMin;
  this->cliquesExtracted = false;
  this->rowMatrixSet = false;
  this->numRestarts = 0;
  this->numRestartsRoot = 0;
  this->numCliqueEntriesAfterPresolve = 0;
  this->numCliqueEntriesAfterFirstPresolve = 0;
  *(undefined8 *)&this->maxTreeSizeLog2 = 0;
  *(undefined8 *)((long)&(this->pruned_treeweight).hi + 4) = 0;
  (this->pruned_treeweight).lo = 0.0;
  this->avgrootlpiters = 0.0;
  memset(&this->num_nodes,0,0x84);
  this->lower_bound = -INFINITY;
  this->upper_bound = INFINITY;
  dVar1 = (pHVar3->super_HighsOptionsStruct).objective_bound;
  this->upper_limit = dVar1;
  this->optimality_limit = dVar1;
  (this->primal_dual_integral).value = -INFINITY;
  iVar4 = (pHVar3->super_HighsOptionsStruct).mip_report_level;
  iVar7 = 100;
  if (iVar4 == 1) {
    iVar7 = 2000;
  }
  iVar8 = 0;
  if (iVar4 != 0) {
    iVar8 = iVar7;
  }
  this->dispfreq = iVar8;
  return iVar4;
}

Assistant:

void HighsMipSolverData::init() {
  postSolveStack.initializeIndexMaps(mipsolver.model_->num_row_,
                                     mipsolver.model_->num_col_);
  mipsolver.orig_model_ = mipsolver.model_;
  feastol = mipsolver.options_mip_->mip_feasibility_tolerance;
  epsilon = mipsolver.options_mip_->small_matrix_value;
  if (mipsolver.clqtableinit)
    cliquetable.buildFrom(mipsolver.orig_model_, *mipsolver.clqtableinit);
  cliquetable.setMinEntriesForParallelism(
      highs::parallel::num_threads() > 1
          ? mipsolver.options_mip_->mip_min_cliquetable_entries_for_parallelism
          : kHighsIInf);
  if (mipsolver.implicinit) implications.buildFrom(*mipsolver.implicinit);
  heuristic_effort = mipsolver.options_mip_->mip_heuristic_effort;
  detectSymmetries = mipsolver.options_mip_->mip_detect_symmetry;

  firstlpsolobj = -kHighsInf;
  rootlpsolobj = -kHighsInf;
  analyticCenterComputed = false;
  analyticCenterStatus = HighsModelStatus::kNotset;
  maxTreeSizeLog2 = 0;
  numRestarts = 0;
  numRestartsRoot = 0;
  numImprovingSols = 0;
  pruned_treeweight = 0;
  avgrootlpiters = 0;
  num_nodes = 0;
  num_nodes_before_run = 0;
  num_leaves = 0;
  num_leaves_before_run = 0;
  total_repair_lp = 0;
  total_repair_lp_feasible = 0;
  total_repair_lp_iterations = 0;
  total_lp_iterations = 0;
  heuristic_lp_iterations = 0;
  sepa_lp_iterations = 0;
  sb_lp_iterations = 0;
  total_lp_iterations_before_run = 0;
  heuristic_lp_iterations_before_run = 0;
  sepa_lp_iterations_before_run = 0;
  sb_lp_iterations_before_run = 0;
  num_disp_lines = 0;
  numCliqueEntriesAfterPresolve = 0;
  numCliqueEntriesAfterFirstPresolve = 0;
  cliquesExtracted = false;
  rowMatrixSet = false;
  lower_bound = -kHighsInf;
  upper_bound = kHighsInf;
  upper_limit = mipsolver.options_mip_->objective_bound;
  optimality_limit = mipsolver.options_mip_->objective_bound;
  primal_dual_integral.initialise();

  if (mipsolver.options_mip_->mip_report_level == 0)
    dispfreq = 0;
  else if (mipsolver.options_mip_->mip_report_level == 1)
    dispfreq = 2000;
  else
    dispfreq = 100;
}